

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2435f::TestStreamingTextCopiesCharacters::RunImpl
          (TestStreamingTextCopiesCharacters *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  char *actual;
  TestDetails **ppTVar2;
  TestDetails TStack_1c8;
  MemoryOutStream stream;
  
  UnitTest::MemoryOutStream::MemoryOutStream(&stream);
  std::operator<<((ostream *)&stream,"Lalala");
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  actual = UnitTest::MemoryOutStream::GetText(&stream);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&TStack_1c8,*ppTVar2,0x16);
  UnitTest::CheckEqual(results,"Lalala",actual,&TStack_1c8);
  UnitTest::MemoryOutStream::~MemoryOutStream(&stream);
  return;
}

Assistant:

TEST(StreamingTextCopiesCharacters)
{
    MemoryOutStream stream;
    stream << "Lalala";
    CHECK_EQUAL("Lalala", stream.GetText());
}